

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SPIRVShaderResources.cpp
# Opt level: O3

void __thiscall
Diligent::SPIRVShaderResources::MapHLSLVertexShaderInputs
          (SPIRVShaderResources *this,vector<unsigned_int,_std::allocator<unsigned_int>_> *SPIRV)

{
  byte *pbVar1;
  char cVar2;
  byte bVar3;
  int iVar4;
  SPIRVShaderStageInputAttribs *Args;
  long lVar5;
  char *pcVar6;
  byte *__nptr;
  Uint32 n;
  string msg;
  char *EndPtr;
  char (*in_stack_ffffffffffffff98) [11];
  string local_60;
  char *local_40;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *local_38;
  
  local_38 = SPIRV;
  if (this->m_IsHLSLSource == false) {
    FormatString<char[45]>(&local_60,(char (*) [45])"This method is only relevant for HLSL source");
    DebugAssertionFailed
              (local_60._M_dataplus._M_p,"MapHLSLVertexShaderInputs",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/ShaderTools/src/SPIRVShaderResources.cpp"
               ,0x336);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_60._M_dataplus._M_p != &local_60.field_2) {
      operator_delete(local_60._M_dataplus._M_p,local_60.field_2._M_allocated_capacity + 1);
    }
  }
  if (this->m_NumShaderStageInputs != 0) {
    n = 0;
    do {
      Args = GetShaderStageInputAttribs(this,n);
      __nptr = (byte *)Args->Semantic;
      bVar3 = *__nptr;
      pcVar6 = MapHLSLVertexShaderInputs::Prefix;
      while (bVar3 != 0) {
        cVar2 = *pcVar6;
        if (cVar2 == '\0') goto LAB_002a841f;
        iVar4 = tolower((uint)bVar3);
        if (iVar4 != cVar2) break;
        pcVar6 = pcVar6 + 1;
        pbVar1 = __nptr + 1;
        __nptr = __nptr + 1;
        bVar3 = *pbVar1;
      }
      if (*pcVar6 == '\0') {
LAB_002a841f:
        local_40 = (char *)0x0;
        lVar5 = strtol((char *)__nptr,&local_40,10);
        if (*local_40 != '\0') {
          FormatString<char[25],char_const*,char[43],char_const*,char[11]>
                    (&local_60,(Diligent *)"Unable to map semantic \'",(char (*) [25])Args,
                     (char **)"\' to input location: semantics must have \'",
                     (char (*) [43])&MapHLSLVertexShaderInputs::Prefix,(char **)"x\' format.",
                     in_stack_ffffffffffffff98);
          if (DebugMessageCallback != (undefined *)0x0) {
            (*(code *)DebugMessageCallback)(2,local_60._M_dataplus._M_p,0,0,0);
          }
          goto LAB_002a848f;
        }
        (local_38->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
        super__Vector_impl_data._M_start[Args->LocationDecorationOffset] = (uint)lVar5;
      }
      else {
        FormatString<char[25],char_const*,char[43],char_const*,char[11]>
                  (&local_60,(Diligent *)"Unable to map semantic \'",(char (*) [25])Args,
                   (char **)"\' to input location: semantics must have \'",
                   (char (*) [43])&MapHLSLVertexShaderInputs::Prefix,(char **)"x\' format.",
                   in_stack_ffffffffffffff98);
        if (DebugMessageCallback != (undefined *)0x0) {
          (*(code *)DebugMessageCallback)(2,local_60._M_dataplus._M_p,0,0,0);
        }
LAB_002a848f:
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_60._M_dataplus._M_p != &local_60.field_2) {
          operator_delete(local_60._M_dataplus._M_p,local_60.field_2._M_allocated_capacity + 1);
        }
      }
      n = n + 1;
    } while (n < this->m_NumShaderStageInputs);
  }
  return;
}

Assistant:

void SPIRVShaderResources::MapHLSLVertexShaderInputs(std::vector<uint32_t>& SPIRV) const
{
    VERIFY(IsHLSLSource(), "This method is only relevant for HLSL source");

    for (Uint32 i = 0; i < GetNumShaderStageInputs(); ++i)
    {
        const SPIRVShaderStageInputAttribs& Input = GetShaderStageInputAttribs(i);

        const char*        s      = Input.Semantic;
        static const char* Prefix = "attrib";
        const char*        p      = Prefix;
        while (*s != 0 && *p != 0 && *p == std::tolower(static_cast<unsigned char>(*s)))
        {
            ++p;
            ++s;
        }

        if (*p != 0)
        {
            LOG_ERROR_MESSAGE("Unable to map semantic '", Input.Semantic, "' to input location: semantics must have '", Prefix, "x' format.");
            continue;
        }

        char*    EndPtr   = nullptr;
        uint32_t Location = static_cast<uint32_t>(strtol(s, &EndPtr, 10));
        if (*EndPtr != 0)
        {
            LOG_ERROR_MESSAGE("Unable to map semantic '", Input.Semantic, "' to input location: semantics must have '", Prefix, "x' format.");
            continue;
        }
        SPIRV[Input.LocationDecorationOffset] = Location;
    }
}